

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

bool __thiscall miniscript::Node<CPubKey>::IsSane(Node<CPubKey> *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsValidTopLevel(this);
  if (bVar2) {
    bVar2 = IsSaneSubexpression(this);
    if (bVar2) {
      bVar2 = (bool)((*(byte *)((long)&(this->typ).m_flags + 1) & 8) >> 3);
      goto LAB_003c4596;
    }
  }
  bVar2 = false;
LAB_003c4596:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool IsSane() const { return IsValidTopLevel() && IsSaneSubexpression() && NeedsSignature(); }